

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash.h
# Opt level: O2

void __thiscall
highwayhash::HighwayHashCatT<1U>::Finalize<unsigned_long>
          (HighwayHashCatT<1U> *this,unsigned_long *hash)

{
  long lVar1;
  HHStateT<1U> *pHVar2;
  HHStateT<1U> *pHVar3;
  HHStateT<1U> state_copy;
  
  pHVar2 = &this->state_;
  pHVar3 = &state_copy;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pHVar3->v0[0] = pHVar2->v0[0];
    pHVar2 = (HHStateT<1U> *)(pHVar2->v0 + 1);
    pHVar3 = (HHStateT<1U> *)((long)pHVar3 + 8);
  }
  if (this->buffer_usage_ != 0) {
    Portable::HHStatePortable::UpdateRemainder(&state_copy,this->buffer_,this->buffer_usage_);
  }
  Portable::HHStatePortable::Finalize(&state_copy,hash);
  return;
}

Assistant:

HH_INLINE void Finalize(Result* HH_RESTRICT hash) const {
    // BeginIACA();
    HHStateT<Target> state_copy = state_;
    const size_t buffer_usage = buffer_usage_;
    if (HH_LIKELY(buffer_usage != 0)) {
      state_copy.UpdateRemainder(buffer_, buffer_usage);
    }
    state_copy.Finalize(hash);
    // EndIACA();
  }